

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

size_t __thiscall
ContextSpecificHolder<Integer,_(unsigned_char)'\x82',_(OptionType)0>::EncodedSize
          (ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *this)

{
  size_t sVar1;
  ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *this_local;
  
  sVar1 = DerBase::GetcbData((DerBase *)this);
  if (sVar1 == 0) {
    this_local = (ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *)0x0;
  }
  else {
    this_local = (ContextSpecificHolder<Integer,_(unsigned_char)__x82_,_(OptionType)0> *)
                 DerBase::EncodedSize((DerBase *)this);
  }
  return (size_t)this_local;
}

Assistant:

size_t EncodedSize() 
	{
		if (innerType.GetcbData() == 0)
			return 0;

		return innerType.EncodedSize(); 
	}